

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElfFile.cpp
# Opt level: O0

void __thiscall ElfFile::save(ElfFile *this,path *fileName)

{
  ushort uVar1;
  uint uVar2;
  Endianness endianness_00;
  size_t sVar3;
  size_type sVar4;
  reference ppEVar5;
  reference ppEVar6;
  size_t pos_1;
  size_t i_4;
  size_t pos;
  size_t i_3;
  ulong uStack_30;
  Endianness endianness;
  size_t i_2;
  size_t i_1;
  size_t i;
  path *fileName_local;
  ElfFile *this_local;
  
  ByteArray::clear(&this->fileData);
  ByteArray::reserveBytes(&this->fileData,0x34,'\0');
  for (i_1 = 0; i_1 < 4; i_1 = i_1 + 1) {
    switch(this->partsOrder[i_1]) {
    case ELFPART_SEGMENTTABLE:
      ByteArray::alignSize(&this->fileData,4);
      sVar3 = ByteArray::size(&this->fileData);
      (this->fileHeader).e_phoff = (Elf32_Off)sVar3;
      sVar4 = std::vector<ElfSegment_*,_std::allocator<ElfSegment_*>_>::size(&this->segments);
      ByteArray::reserveBytes(&this->fileData,sVar4 * (this->fileHeader).e_phentsize,'\0');
      break;
    case ELFPART_SECTIONTABLE:
      ByteArray::alignSize(&this->fileData,4);
      sVar3 = ByteArray::size(&this->fileData);
      (this->fileHeader).e_shoff = (Elf32_Off)sVar3;
      sVar4 = std::vector<ElfSection_*,_std::allocator<ElfSection_*>_>::size(&this->sections);
      ByteArray::reserveBytes(&this->fileData,sVar4 * (this->fileHeader).e_shentsize,'\0');
      break;
    case ELFPART_SEGMENTS:
      for (i_2 = 0; sVar4 = std::vector<ElfSegment_*,_std::allocator<ElfSegment_*>_>::size
                                      (&this->segments), i_2 < sVar4; i_2 = i_2 + 1) {
        ppEVar5 = std::vector<ElfSegment_*,_std::allocator<ElfSegment_*>_>::operator[]
                            (&this->segments,i_2);
        ElfSegment::writeData(*ppEVar5,&this->fileData);
      }
      break;
    case ELFPART_SEGMENTLESSSECTIONS:
      for (uStack_30 = 0;
          sVar4 = std::vector<ElfSection_*,_std::allocator<ElfSection_*>_>::size
                            (&this->segmentlessSections), uStack_30 < sVar4;
          uStack_30 = uStack_30 + 1) {
        ppEVar6 = std::vector<ElfSection_*,_std::allocator<ElfSection_*>_>::operator[]
                            (&this->segmentlessSections,uStack_30);
        ElfSection::writeData(*ppEVar6,&this->fileData);
      }
    }
  }
  endianness_00 = getEndianness(this);
  writeHeader(this,&this->fileData,0,endianness_00);
  for (pos = 0; sVar4 = std::vector<ElfSegment_*,_std::allocator<ElfSegment_*>_>::size
                                  (&this->segments), pos < sVar4; pos = pos + 1) {
    uVar2 = (this->fileHeader).e_phoff;
    uVar1 = (this->fileHeader).e_phentsize;
    ppEVar5 = std::vector<ElfSegment_*,_std::allocator<ElfSegment_*>_>::operator[]
                        (&this->segments,pos);
    ElfSegment::writeHeader(*ppEVar5,&this->fileData,(ulong)uVar2 + pos * uVar1,endianness_00);
  }
  for (pos_1 = 0;
      sVar4 = std::vector<ElfSection_*,_std::allocator<ElfSection_*>_>::size(&this->sections),
      pos_1 < sVar4; pos_1 = pos_1 + 1) {
    uVar2 = (this->fileHeader).e_shoff;
    uVar1 = (this->fileHeader).e_shentsize;
    ppEVar6 = std::vector<ElfSection_*,_std::allocator<ElfSection_*>_>::operator[]
                        (&this->sections,pos_1);
    ElfSection::writeHeader(*ppEVar6,&this->fileData,(ulong)uVar2 + pos_1 * uVar1,endianness_00);
  }
  ByteArray::toFile(&this->fileData,fileName);
  return;
}

Assistant:

void ElfFile::save(const fs::path& fileName)
{
	fileData.clear();

	// reserve space for header and table data
	fileData.reserveBytes(sizeof(Elf32_Ehdr));

	for (size_t i = 0; i < 4; i++)
	{
		switch (partsOrder[i])
		{
		case ELFPART_SEGMENTTABLE:
			fileData.alignSize(4);
			fileHeader.e_phoff = (Elf32_Off) fileData.size();
			fileData.reserveBytes(segments.size()*fileHeader.e_phentsize);
			break;
		case ELFPART_SECTIONTABLE:
			fileData.alignSize(4);
			fileHeader.e_shoff = (Elf32_Off) fileData.size();
			fileData.reserveBytes(sections.size()*fileHeader.e_shentsize);
			break;
		case ELFPART_SEGMENTS:
			for (size_t i = 0; i < segments.size(); i++)
			{
				segments[i]->writeData(fileData);
			}
			break;
		case ELFPART_SEGMENTLESSSECTIONS:
			for (size_t i = 0; i < segmentlessSections.size(); i++)
			{
				segmentlessSections[i]->writeData(fileData);
			}
			break;
		}
	}

	// copy data to the tables
	Endianness endianness = getEndianness();
	writeHeader(fileData, 0, endianness);
	for (size_t i = 0; i < segments.size(); i++)
	{
		size_t pos = fileHeader.e_phoff+i*fileHeader.e_phentsize;
		segments[i]->writeHeader(fileData, pos, endianness);
	}
	
	for (size_t i = 0; i < sections.size(); i++)
	{
		size_t pos = fileHeader.e_shoff+i*fileHeader.e_shentsize;
		sections[i]->writeHeader(fileData, pos, endianness);
	}

	fileData.toFile(fileName);
}